

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseBuilder::newAlignNode
          (BaseBuilder *this,AlignNode **out,AlignMode alignMode,uint32_t alignment)

{
  Error EVar1;
  uint *in_RSI;
  AlignMode *in_RDI;
  undefined3 unaff_retaddr;
  undefined4 uVar2;
  
  in_RSI[0] = 0;
  in_RSI[1] = 0;
  EVar1 = _newNodeT<asmjit::v1_14::AlignNode,asmjit::v1_14::AlignMode&,unsigned_int&>
                    ((BaseBuilder *)out,(AlignNode **)CONCAT44(uVar2,alignment),in_RDI,in_RSI);
  return EVar1;
}

Assistant:

Error BaseBuilder::newAlignNode(AlignNode** out, AlignMode alignMode, uint32_t alignment) {
  *out = nullptr;
  return _newNodeT<AlignNode>(out, alignMode, alignment);
}